

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_check_digest_access_authentication(mg_connection *conn,char *realm,char *filename)

{
  int iVar1;
  undefined1 local_50 [4];
  int auth;
  mg_file file;
  char *filename_local;
  char *realm_local;
  mg_connection *conn_local;
  
  file.access.fp = (FILE *)filename;
  memset(local_50,0,0x28);
  if ((conn == (mg_connection *)0x0) || (file.access.fp == (FILE *)0x0)) {
    conn_local._4_4_ = -1;
  }
  else {
    iVar1 = mg_fopen(conn,(char *)file.access.fp,1,(mg_file *)local_50);
    if (iVar1 == 0) {
      conn_local._4_4_ = -2;
    }
    else {
      conn_local._4_4_ = authorize(conn,(mg_file *)local_50,realm);
      mg_fclose((mg_file_access *)&file.stat.location);
    }
  }
  return conn_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_check_digest_access_authentication(struct mg_connection *conn,
                                      const char *realm,
                                      const char *filename)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;
	int auth;

	if (!conn || !filename) {
		return -1;
	}
	if (!mg_fopen(conn, filename, MG_FOPEN_MODE_READ, &file)) {
		return -2;
	}

	auth = authorize(conn, &file, realm);

	mg_fclose(&file.access);

	return auth;
}